

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTinySVD.cpp
# Opt level: O3

void testTinySVD_4x4<float>(Matrix44<float> *A)

{
  bool bVar1;
  ostream *poVar2;
  float (*pafVar3) [4];
  int i;
  long lVar4;
  int j;
  long lVar5;
  int cols [4];
  Matrix44<float> B;
  int local_88 [6];
  float local_70;
  float local_6c [15];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Verifying SVD for [[",0x14);
  poVar2 = std::ostream::_M_insert<double>((double)A->x[0][0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>((double)A->x[0][1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>((double)A->x[0][2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>((double)A->x[0][3]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"], ",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"[",1);
  poVar2 = std::ostream::_M_insert<double>((double)A->x[1][0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>((double)A->x[1][1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>((double)A->x[1][2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>((double)A->x[1][3]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"], ",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"[",1);
  poVar2 = std::ostream::_M_insert<double>((double)A->x[2][0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>((double)A->x[2][1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>((double)A->x[2][2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>((double)A->x[2][3]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"], ",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"[",1);
  poVar2 = std::ostream::_M_insert<double>((double)A->x[3][0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>((double)A->x[3][1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>((double)A->x[3][2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>((double)A->x[3][3]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]]\n",3);
  verifyTinySVD_4x4<float>(A);
  local_70 = A->x[0][0];
  local_6c[0xe] = A->x[3][3];
  local_6c[1] = A->x[2][0];
  local_6c[0] = A->x[1][0];
  local_6c[3] = A->x[0][1];
  local_6c[2] = A->x[3][0];
  local_6c[5] = A->x[2][1];
  local_6c[4] = A->x[1][1];
  local_6c[7] = A->x[0][2];
  local_6c[6] = A->x[3][1];
  local_6c[9] = A->x[2][2];
  local_6c[8] = A->x[1][2];
  local_6c[0xb] = A->x[0][3];
  local_6c[10] = A->x[3][2];
  local_6c[0xd] = A->x[2][3];
  local_6c[0xc] = A->x[1][3];
  verifyTinySVD_4x4<float>((Matrix44<float> *)&local_70);
  local_88[0] = 0;
  local_88[1] = 1;
  local_88[2] = 2;
  local_88[3] = 3;
  do {
    local_6c[10] = 0.0;
    local_6c[0xb] = 0.0;
    local_6c[6] = 0.0;
    local_6c[7] = 0.0;
    local_6c[0] = 0.0;
    local_6c[1] = 0.0;
    local_6c[2] = 0.0;
    local_6c[3] = 0.0;
    local_6c[0xc] = 0.0;
    local_6c[0xd] = 0.0;
    local_70 = 1.0;
    local_6c[4] = 1.0;
    local_6c[5] = 0.0;
    local_6c[8] = 0.0;
    local_6c[9] = 1.0;
    local_6c[0xe] = 1.0;
    lVar4 = 0;
    pafVar3 = (float (*) [4])&local_70;
    do {
      lVar5 = 0;
      do {
        (*(float (*) [4])*pafVar3)[lVar5] = A->x[lVar4][local_88[lVar5]];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      lVar4 = lVar4 + 1;
      pafVar3 = pafVar3 + 1;
    } while (lVar4 != 4);
    verifyTinySVD_4x4<float>((Matrix44<float> *)&local_70);
    bVar1 = std::__next_permutation<int*,__gnu_cxx::__ops::_Iter_less_iter>(local_88);
  } while (bVar1);
  return;
}

Assistant:

void
testTinySVD_4x4 (const IMATH_INTERNAL_NAMESPACE::Matrix44<T>& A)
{
    std::cout << "Verifying SVD for [[" << A[0][0] << ", " << A[0][1] << ", " << A[0][2] << ", " << A[0][3] << "], "
                                 << "[" << A[1][0] << ", " << A[1][1] << ", " << A[1][2] << ", " << A[1][3] << "], "
                                 << "[" << A[2][0] << ", " << A[2][1] << ", " << A[2][2] << ", " << A[2][3] << "], "
                                 << "[" << A[3][0] << ", " << A[3][1] << ", " << A[3][2] << ", " << A[3][3] << "]]\n";
 
    verifyTinySVD_4x4 (A);
    verifyTinySVD_4x4 (A.transposed());

    // Try all different orderings of the columns of A:
    int cols[4] = { 0, 1, 2, 3 };
    do
    {
        IMATH_INTERNAL_NAMESPACE::Matrix44<T> B;
        for (int i = 0; i < 4; ++i)
            for (int j = 0; j < 4; ++j)
                B[i][j] = A[i][cols[j]];

        verifyTinySVD_4x4 (B);
    } while (std::next_permutation (cols, cols + 4));
}